

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

Matrix * rlGetMatrixTransform(void)

{
  Matrix *in_RDI;
  Matrix *mat;
  
  MatrixIdentity();
  memcpy(in_RDI,&RLGL.State.transform,0x40);
  return in_RDI;
}

Assistant:

Matrix rlGetMatrixTransform(void)
{
    Matrix mat = MatrixIdentity();
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // TODO: Consider possible transform matrices in the RLGL.State.stack
    // Is this the right order? or should we start with the first stored matrix instead of the last one?
    //Matrix matStackTransform = MatrixIdentity();
    //for (int i = RLGL.State.stackCounter; i > 0; i--) matStackTransform = MatrixMultiply(RLGL.State.stack[i], matStackTransform);
    mat = RLGL.State.transform;
#endif
    return mat;
}